

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
          (PipelineResourceSignatureDescWrapper *this,char *PSOName,
          PipelineResourceLayoutDesc *ResourceLayout,Uint32 SRBAllocationGranularity)

{
  Char *pCVar1;
  uint local_38;
  Uint32 i;
  Uint32 SRBAllocationGranularity_local;
  PipelineResourceLayoutDesc *ResourceLayout_local;
  char *PSOName_local;
  PipelineResourceSignatureDescWrapper *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->m_CombinedSamplerSuffix);
  std::vector<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>::
  vector(&this->m_Resources);
  std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
  vector(&this->m_ImmutableSamplers);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->m_StringPool);
  PipelineResourceSignatureDesc::PipelineResourceSignatureDesc(&this->m_Desc);
  if (PSOName != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,"Implicit signature of PSO \'");
    std::__cxx11::string::operator+=((string *)this,PSOName);
    std::__cxx11::string::operator+=((string *)this,'\'');
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    (this->m_Desc).super_DeviceObjectAttribs.Name = pCVar1;
  }
  std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
  reserve(&this->m_ImmutableSamplers,(ulong)ResourceLayout->NumImmutableSamplers);
  for (local_38 = 0; local_38 < ResourceLayout->NumImmutableSamplers; local_38 = local_38 + 1) {
    AddImmutableSampler<Diligent::ImmutableSamplerDesc_const&>
              (this,ResourceLayout->ImmutableSamplers + local_38);
  }
  (this->m_Desc).SRBAllocationGranularity = SRBAllocationGranularity;
  return;
}

Assistant:

PipelineResourceSignatureDescWrapper(const char*                       PSOName,
                                         const PipelineResourceLayoutDesc& ResourceLayout,
                                         Uint32                            SRBAllocationGranularity)
    {
        if (PSOName != nullptr)
        {
            m_Name = "Implicit signature of PSO '";
            m_Name += PSOName;
            m_Name += '\'';
            m_Desc.Name = m_Name.c_str();
        }

        m_ImmutableSamplers.reserve(ResourceLayout.NumImmutableSamplers);
        for (Uint32 i = 0; i < ResourceLayout.NumImmutableSamplers; ++i)
            AddImmutableSampler(ResourceLayout.ImmutableSamplers[i]);

        m_Desc.SRBAllocationGranularity = SRBAllocationGranularity;
    }